

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_optimize_expr.cpp
# Opt level: O0

bool anon_unknown.dwarf_4e3b::test_optim_equiv_random
               (string *str,uint32_t var_id,double xmin,double xmax)

{
  uint uVar1;
  long lVar2;
  ostream *poVar3;
  reference pvVar4;
  uint in_ESI;
  Expr *this;
  double dVar5;
  Environment *__value;
  double ofx;
  double fx;
  double x;
  int i;
  uniform_real_distribution<double> unif;
  int cnt;
  Expr orig;
  Expr expr;
  string err;
  string *this_00;
  ostream *in_stack_fffffffffffffe90;
  double in_stack_fffffffffffffe98;
  double in_stack_fffffffffffffea0;
  string *in_stack_fffffffffffffea8;
  Environment *in_stack_fffffffffffffeb0;
  undefined6 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec6;
  undefined1 in_stack_fffffffffffffec7;
  Environment *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffef8;
  int num_passes;
  string *this_01;
  int local_d4;
  int local_bc;
  size_t in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff5e;
  undefined1 in_stack_ffffffffffffff5f;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  string *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff80;
  allocator<char> local_49;
  string local_48 [52];
  uint local_14;
  byte local_1;
  
  num_passes = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  local_14 = in_ESI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8,
             (allocator<char> *)
             CONCAT17(in_stack_fffffffffffffec7,
                      CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0)));
  nivalis::Environment::set
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  this_00 = (string *)&stack0xffffffffffffff80;
  std::__cxx11::string::string(this_00);
  this_01 = this_00;
  nivalis::parse(in_stack_ffffffffffffff68,
                 (Environment *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 (bool)in_stack_ffffffffffffff5f,(bool)in_stack_ffffffffffffff5e,
                 in_stack_ffffffffffffff50,in_stack_ffffffffffffff80);
  nivalis::util::trim((string *)0x10f666);
  lVar2 = std::__cxx11::string::size();
  if (lVar2 == 0) {
    nivalis::Expr::Expr((Expr *)in_stack_fffffffffffffe90,(Expr *)this_00);
    nivalis::Expr::optimize((Expr *)this_01,num_passes);
    local_bc = 0;
    std::uniform_real_distribution<double>::uniform_real_distribution
              ((uniform_real_distribution<double> *)in_stack_fffffffffffffe90,(double)this_00,
               5.49391610928195e-318);
    for (local_d4 = 0; local_d4 < 1000; local_d4 = local_d4 + 1) {
      this = (Expr *)std::uniform_real_distribution<double>::operator()
                               ((uniform_real_distribution<double> *)in_stack_fffffffffffffe90,
                                (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                 *)this_00);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(anonymous_namespace)::env,
                          (ulong)local_14);
      *pvVar4 = (value_type)this;
      dVar5 = nivalis::Expr::operator()(this,in_stack_fffffffffffffec8);
      __value = (Environment *)nivalis::Expr::operator()(this,in_stack_fffffffffffffec8);
      in_stack_fffffffffffffec8 = __value;
      uVar1 = std::isnan(dVar5);
      if (((uVar1 & 1) == 0) || (uVar1 = std::isnan((double)__value), (uVar1 & 1) == 0)) {
        dVar5 = absrelerr<double>(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
        local_bc = (uint)(dVar5 < 1e-06) + local_bc;
      }
      else {
        local_bc = local_bc + 1;
      }
    }
    if (local_bc != 1000) {
      std::operator<<((ostream *)&std::cerr,"Optimization equiv test fail\nopti ");
      poVar3 = nivalis::operator<<(in_stack_fffffffffffffe90,(Expr *)this_00);
      std::operator<<(poVar3,"\norig ");
      poVar3 = nivalis::operator<<(in_stack_fffffffffffffe90,(Expr *)this_00);
      std::operator<<(poVar3,"\n");
    }
    local_1 = local_bc == 1000;
    nivalis::Expr::~Expr((Expr *)0x10fa0e);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"Provided expression failed to parse: ");
    poVar3 = std::operator<<(poVar3,(string *)&stack0xffffffffffffff80);
    std::operator<<(poVar3,"\n");
    local_1 = 0;
  }
  nivalis::Expr::~Expr((Expr *)0x10fa1b);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  return (bool)(local_1 & 1);
}

Assistant:

bool test_optim_equiv_random(const std::string& str,
            uint32_t var_id,
            double xmin = -100, double xmax = 100) {
        env.set("a", 10.);
        std::string err;
        Expr expr = parse(str, env, false, true, 0, &err);
        util::trim(err);
        if (err.size()) {
            std::cout << "Provided expression failed to parse: " << err << "\n";
            return false;
        }
        Expr orig = expr;
        expr.optimize();
        int cnt = 0;
        static const int N_ITER = 1000;
        std::uniform_real_distribution<double> unif(xmin, xmax);
        for (int i = 0; i < N_ITER; ++i) {
            double x = unif(test::reng);
            env.vars[var_id] = x;
            double fx = expr(env);
            double ofx = orig(env);
            if (std::isnan(fx) && std::isnan(ofx)) ++cnt;
            else cnt += (absrelerr(fx, ofx) < FLOAT_EPS);
        }
        if (cnt != N_ITER) {
            std::cerr << "Optimization equiv test fail\nopti " << expr <<
                "\norig " << orig << "\n";
            return false;
        }
        return true;
    }